

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
slang::
SmallVectorBase<std::tuple<slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>>
::
emplace_back<std::tuple<slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>>
          (SmallVectorBase<std::tuple<slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>>
           *this,tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
                 *args)

{
  SmallVectorBase<std::tuple<slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>>
  *pSVar1;
  undefined8 *puVar2;
  ulong uVar3;
  SmallVectorBase<std::tuple<slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>>
  *p;
  undefined8 uVar4;
  void *pvVar5;
  long lVar6;
  long lVar7;
  SmallVectorBase<std::tuple<slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>>
  *pSVar8;
  long lVar9;
  ulong uVar10;
  
  pSVar8 = (SmallVectorBase<std::tuple<slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>>
            *)(*(long *)(this + 8) * 0x18 + *(long *)this);
  if (*(long *)(this + 8) != *(long *)(this + 0x10)) {
    uVar4 = *(undefined8 *)
             ((long)&(args->
                     super__Tuple_impl<0UL,_const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
                     ).
                     super__Tuple_impl<1UL,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
                     .
                     super__Head_base<1UL,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>,_false>
                     ._M_head_impl.
                     super__Variant_base<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                     .
                     super__Move_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                     .
                     super__Copy_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
             + 8);
    *(undefined8 *)pSVar8 =
         *(undefined8 *)
          &(args->
           super__Tuple_impl<0UL,_const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
           ).
           super__Tuple_impl<1UL,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
           .
           super__Head_base<1UL,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>,_false>
           ._M_head_impl.
           super__Variant_base<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
           .
           super__Move_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
           .
           super__Copy_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
    ;
    *(undefined8 *)(pSVar8 + 8) = uVar4;
    *(Symbol **)(pSVar8 + 0x10) =
         (args->
         super__Tuple_impl<0UL,_const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
         ).super__Head_base<0UL,_const_slang::ast::Symbol_*,_false>._M_head_impl;
    lVar6 = *(long *)(this + 8);
    *(long *)(this + 8) = lVar6 + 1;
    return (reference)(lVar6 * 0x18 + *(long *)this);
  }
  if (*(long *)(this + 8) == 0x555555555555555) {
    detail::throwLengthError();
  }
  uVar10 = *(long *)(this + 8) + 1;
  uVar3 = *(ulong *)(this + 0x10);
  if (uVar10 < uVar3 * 2) {
    uVar10 = uVar3 * 2;
  }
  if (0x555555555555555 - uVar3 < uVar3) {
    uVar10 = 0x555555555555555;
  }
  lVar9 = (long)pSVar8 - *(long *)this;
  pvVar5 = operator_new(uVar10 * 0x18);
  uVar4 = *(undefined8 *)
           ((long)&(args->
                   super__Tuple_impl<0UL,_const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
                   ).
                   super__Tuple_impl<1UL,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
                   .
                   super__Head_base<1UL,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>,_false>
                   ._M_head_impl.
                   super__Variant_base<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                   .
                   super__Move_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                   .
                   super__Copy_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
           + 8);
  *(undefined8 *)((long)pvVar5 + lVar9) =
       *(undefined8 *)
        &(args->
         super__Tuple_impl<0UL,_const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
         ).
         super__Tuple_impl<1UL,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
         .
         super__Head_base<1UL,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>,_false>
         ._M_head_impl.
         super__Variant_base<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
         .
         super__Move_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
         .
         super__Copy_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
  ;
  ((undefined8 *)((long)pvVar5 + lVar9))[1] = uVar4;
  *(Symbol **)((long)pvVar5 + lVar9 + 0x10) =
       (args->
       super__Tuple_impl<0UL,_const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
       ).super__Head_base<0UL,_const_slang::ast::Symbol_*,_false>._M_head_impl;
  p = *(SmallVectorBase<std::tuple<slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>>
        **)this;
  lVar6 = *(long *)(this + 8);
  if (p + lVar6 * 0x18 == pSVar8) {
    if (lVar6 != 0) {
      lVar7 = 0;
      do {
        pSVar1 = p + lVar7;
        uVar4 = *(undefined8 *)(pSVar1 + 8);
        *(undefined8 *)((long)pvVar5 + lVar7) = *(undefined8 *)pSVar1;
        ((undefined8 *)((long)pvVar5 + lVar7))[1] = uVar4;
        *(undefined8 *)((long)pvVar5 + lVar7 + 0x10) = *(undefined8 *)(pSVar1 + 0x10);
        lVar7 = lVar7 + 0x18;
      } while (pSVar1 + 0x18 != pSVar8);
    }
  }
  else {
    if (p != pSVar8) {
      lVar7 = 0;
      do {
        pSVar1 = p + lVar7;
        uVar4 = *(undefined8 *)(pSVar1 + 8);
        *(undefined8 *)((long)pvVar5 + lVar7) = *(undefined8 *)pSVar1;
        ((undefined8 *)((long)pvVar5 + lVar7))[1] = uVar4;
        *(undefined8 *)((long)pvVar5 + lVar7 + 0x10) = *(undefined8 *)(pSVar1 + 0x10);
        lVar7 = lVar7 + 0x18;
      } while (pSVar1 + 0x18 != pSVar8);
    }
    lVar7 = 0;
    do {
      pSVar1 = pSVar8 + lVar7;
      uVar4 = *(undefined8 *)(pSVar1 + 8);
      puVar2 = (undefined8 *)((long)pvVar5 + lVar7 + lVar9 + 0x18);
      *puVar2 = *(undefined8 *)pSVar1;
      puVar2[1] = uVar4;
      *(undefined8 *)((long)pvVar5 + lVar7 + lVar9 + 0x28) = *(undefined8 *)(pSVar1 + 0x10);
      lVar7 = lVar7 + 0x18;
    } while (pSVar1 + 0x18 != p + lVar6 * 0x18);
  }
  if (p != this + 0x18) {
    operator_delete(p);
    lVar6 = *(long *)(this + 8);
  }
  *(long *)(this + 8) = lVar6 + 1;
  *(ulong *)(this + 0x10) = uVar10;
  *(void **)this = pvVar5;
  return (reference)((long)pvVar5 + lVar9);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }